

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall
DCanvas::Clear(DCanvas *this,int left,int top,int right,int bottom,int palcolor,uint32 color)

{
  anon_union_4_2_12391d7c_for_PalEntry_0 local_3c;
  BYTE *local_38;
  BYTE *dest;
  int local_28;
  int y;
  int x;
  int palcolor_local;
  int bottom_local;
  int right_local;
  int top_local;
  int left_local;
  DCanvas *this_local;
  
  if ((left != right) && (top != bottom)) {
    y = palcolor;
    x = bottom;
    palcolor_local = right;
    bottom_local = top;
    right_local = left;
    _top_local = this;
    if (right <= left) {
      __assert_fail("left < right",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x4b2,"virtual void DCanvas::Clear(int, int, int, int, int, uint32)");
    }
    if (bottom <= top) {
      __assert_fail("top < bottom",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0x4b3,"virtual void DCanvas::Clear(int, int, int, int, int, uint32)");
    }
    if ((((left < this->Width) && (0 < right)) && (top < this->Height)) && (0 < bottom)) {
      right_local = MAX<int>(0,left);
      palcolor_local = MIN<int>(this->Width,palcolor_local);
      bottom_local = MAX<int>(0,bottom_local);
      x = MIN<int>(this->Height,x);
      if (y < 0) {
        if (color >> 0x18 != 0xff) {
          PalEntry::PalEntry((PalEntry *)&local_3c.field_0,color);
          (*(this->super_DObject)._vptr_DObject[0xe])
                    ((float)(color >> 0x18) / 255.0,this,(ulong)local_3c.d,(ulong)(uint)right_local,
                     (ulong)(uint)bottom_local,(ulong)(uint)(palcolor_local - right_local),
                     (ulong)(uint)(x - bottom_local));
          return;
        }
        y = PalFromRGB(color);
      }
      local_38 = this->Buffer + (long)right_local + (long)(bottom_local * this->Pitch);
      local_28 = palcolor_local - right_local;
      for (dest._4_4_ = bottom_local; dest._4_4_ < x; dest._4_4_ = dest._4_4_ + 1) {
        memset(local_38,y & 0xff,(long)local_28);
        local_38 = local_38 + this->Pitch;
      }
    }
  }
  return;
}

Assistant:

void DCanvas::Clear (int left, int top, int right, int bottom, int palcolor, uint32 color)
{
	int x, y;
	BYTE *dest;

	if (left == right || top == bottom)
	{
		return;
	}

	assert(left < right);
	assert(top < bottom);

	if (left >= Width || right <= 0 || top >= Height || bottom <= 0)
	{
		return;
	}
	left = MAX(0,left);
	right = MIN(Width,right);
	top = MAX(0,top);
	bottom = MIN(Height,bottom);

	if (palcolor < 0)
	{
		if (APART(color) != 255)
		{
			Dim(color, APART(color)/255.f, left, top, right - left, bottom - top);
			return;
		}

		palcolor = PalFromRGB(color);
	}

	dest = Buffer + top * Pitch + left;
	x = right - left;
	for (y = top; y < bottom; y++)
	{
		memset(dest, palcolor, x);
		dest += Pitch;
	}
}